

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseEntityDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlDocPtr pxVar4;
  xmlDtdPtr pxVar5;
  xmlEntityPtr local_58;
  xmlEntityPtr cur;
  xmlChar *pxStack_48;
  int inputid;
  xmlChar *orig;
  xmlChar *pxStack_38;
  int isParameter;
  xmlChar *ndata;
  xmlChar *literal;
  xmlChar *URI;
  xmlChar *value;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  value = (xmlChar *)0x0;
  URI = (xmlChar *)0x0;
  literal = (xmlChar *)0x0;
  ndata = (xmlChar *)0x0;
  pxStack_38 = (xmlChar *)0x0;
  orig._4_4_ = 0;
  pxStack_48 = (xmlChar *)0x0;
  if (*ctxt->input->cur != '<') {
    return;
  }
  if (ctxt->input->cur[1] != '!') {
    return;
  }
  ctxt->input->cur = ctxt->input->cur + 2;
  ctxt->input->col = ctxt->input->col + 2;
  name = (xmlChar *)ctxt;
  if (*ctxt->input->cur == '\0') {
    xmlParserGrow(ctxt);
  }
  if (**(char **)(*(long *)(name + 0x38) + 0x20) != 'E') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) != 'N') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 2) != 'T') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 3) != 'I') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 4) != 'T') {
    return;
  }
  if (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 5) != 'Y') {
    return;
  }
  iVar1 = *(int *)(*(long *)(name + 0x38) + 100);
  *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 6;
  *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 6;
  if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
    xmlParserGrow((xmlParserCtxtPtr)name);
  }
  iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
  if (iVar2 == 0) {
    xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                   "Space required after \'<!ENTITY\'\n");
  }
  if (**(char **)(*(long *)(name + 0x38) + 0x20) == '%') {
    xmlNextChar((xmlParserCtxtPtr)name);
    iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
    if (iVar2 == 0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,"Space required after \'%%\'\n");
    }
    orig._4_4_ = 1;
  }
  value = xmlParseName((xmlParserCtxtPtr)name);
  if (value == (xmlChar *)0x0) {
    xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,"xmlParseEntityDecl: no name\n");
    return;
  }
  pxVar3 = xmlStrchr(value,':');
  if (pxVar3 != (xmlChar *)0x0) {
    xmlNsErr((xmlParserCtxtPtr)name,XML_NS_ERR_COLON,
             "colons are forbidden from entities names \'%s\'\n",value,(xmlChar *)0x0,(xmlChar *)0x0
            );
  }
  iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
  if (iVar2 == 0) {
    xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                   "Space required after the entity name\n");
  }
  if (orig._4_4_ == 0) {
    if ((**(char **)(*(long *)(name + 0x38) + 0x20) == '\"') ||
       (**(char **)(*(long *)(name + 0x38) + 0x20) == '\'')) {
      URI = xmlParseEntityValue((xmlParserCtxtPtr)name,&stack0xffffffffffffffb8);
      if (((*(long *)name != 0) && (*(int *)(name + 0x14c) == 0)) &&
         (*(long *)(*(long *)name + 0x30) != 0)) {
        (**(code **)(*(long *)name + 0x30))(*(undefined8 *)(name + 8),value,1,0,0,URI);
      }
      if ((*(long *)(name + 0x10) == 0) ||
         (iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x10) + 0x68),
                              (xmlChar *)"SAX compatibility mode document"), iVar2 != 0)) {
        if (*(long *)(name + 0x10) == 0) {
          pxVar4 = xmlNewDoc((xmlChar *)"SAX compatibility mode document");
          *(xmlDocPtr *)(name + 0x10) = pxVar4;
          if (*(long *)(name + 0x10) == 0) {
            xmlErrMemory((xmlParserCtxtPtr)name);
            goto LAB_00142f67;
          }
          *(undefined4 *)(*(long *)(name + 0x10) + 0xac) = 0x40;
        }
        if (*(long *)(*(long *)(name + 0x10) + 0x50) == 0) {
          pxVar5 = xmlNewDtd(*(xmlDocPtr *)(name + 0x10),(xmlChar *)"fake",(xmlChar *)0x0,
                             (xmlChar *)0x0);
          *(xmlDtdPtr *)(*(long *)(name + 0x10) + 0x50) = pxVar5;
          if (*(long *)(*(long *)(name + 0x10) + 0x50) == 0) {
            xmlErrMemory((xmlParserCtxtPtr)name);
            goto LAB_00142f67;
          }
        }
        xmlSAX2EntityDecl(name,value,1,(xmlChar *)0x0,(xmlChar *)0x0,URI);
      }
    }
    else {
      literal = xmlParseExternalID((xmlParserCtxtPtr)name,&ndata,1);
      if ((literal == (xmlChar *)0x0) && (ndata == (xmlChar *)0x0)) {
        xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_VALUE_REQUIRED,(char *)0x0);
      }
      if ((literal != (xmlChar *)0x0) && (pxVar3 = xmlStrchr(literal,'#'), pxVar3 != (xmlChar *)0x0)
         ) {
        xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_URI_FRAGMENT,(char *)0x0);
      }
      if ((**(char **)(*(long *)(name + 0x38) + 0x20) != '>') &&
         (iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)name), iVar2 == 0)) {
        xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                       "Space required before \'NDATA\'\n");
      }
      if ((((**(char **)(*(long *)(name + 0x38) + 0x20) == 'N') &&
           (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) == 'D')) &&
          (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 2) == 'A')) &&
         ((*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 3) == 'T' &&
          (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 4) == 'A')))) {
        *(long *)(*(long *)(name + 0x38) + 0x20) = *(long *)(*(long *)(name + 0x38) + 0x20) + 5;
        *(int *)(*(long *)(name + 0x38) + 0x38) = *(int *)(*(long *)(name + 0x38) + 0x38) + 5;
        if (**(char **)(*(long *)(name + 0x38) + 0x20) == '\0') {
          xmlParserGrow((xmlParserCtxtPtr)name);
        }
        iVar2 = xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
        if (iVar2 == 0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,
                         "Space required after \'NDATA\'\n");
        }
        pxStack_38 = xmlParseName((xmlParserCtxtPtr)name);
        if (((*(long *)name != 0) && (*(int *)(name + 0x14c) == 0)) &&
           (*(long *)(*(long *)name + 0x50) != 0)) {
          (**(code **)(*(long *)name + 0x50))
                    (*(undefined8 *)(name + 8),value,ndata,literal,pxStack_38);
        }
      }
      else {
        if ((*(long *)name != 0) &&
           ((*(int *)(name + 0x14c) == 0 && (*(long *)(*(long *)name + 0x30) != 0)))) {
          (**(code **)(*(long *)name + 0x30))(*(undefined8 *)(name + 8),value,2,ndata,literal,0);
        }
        if ((*(int *)(name + 0x1c) != 0) &&
           ((*(long *)(name + 0x10) == 0 ||
            (iVar2 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x10) + 0x68),
                                 (xmlChar *)"SAX compatibility mode document"), iVar2 != 0)))) {
          if (*(long *)(name + 0x10) == 0) {
            pxVar4 = xmlNewDoc((xmlChar *)"SAX compatibility mode document");
            *(xmlDocPtr *)(name + 0x10) = pxVar4;
            if (*(long *)(name + 0x10) == 0) {
              xmlErrMemory((xmlParserCtxtPtr)name);
              goto LAB_00142f67;
            }
            *(undefined4 *)(*(long *)(name + 0x10) + 0xac) = 0x40;
          }
          if (*(long *)(*(long *)(name + 0x10) + 0x50) == 0) {
            pxVar5 = xmlNewDtd(*(xmlDocPtr *)(name + 0x10),(xmlChar *)"fake",(xmlChar *)0x0,
                               (xmlChar *)0x0);
            *(xmlDtdPtr *)(*(long *)(name + 0x10) + 0x50) = pxVar5;
            if (*(long *)(*(long *)(name + 0x10) + 0x50) == 0) {
              xmlErrMemory((xmlParserCtxtPtr)name);
              goto LAB_00142f67;
            }
          }
          xmlSAX2EntityDecl(name,value,2,ndata,literal,(xmlChar *)0x0);
        }
      }
    }
  }
  else if ((**(char **)(*(long *)(name + 0x38) + 0x20) == '\"') ||
          (**(char **)(*(long *)(name + 0x38) + 0x20) == '\'')) {
    URI = xmlParseEntityValue((xmlParserCtxtPtr)name,&stack0xffffffffffffffb8);
    if ((URI != (xmlChar *)0x0) &&
       (((*(long *)name != 0 && (*(int *)(name + 0x14c) == 0)) &&
        (*(long *)(*(long *)name + 0x30) != 0)))) {
      (**(code **)(*(long *)name + 0x30))(*(undefined8 *)(name + 8),value,4,0,0,URI);
    }
  }
  else {
    literal = xmlParseExternalID((xmlParserCtxtPtr)name,&ndata,1);
    if ((literal == (xmlChar *)0x0) && (ndata == (xmlChar *)0x0)) {
      xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_VALUE_REQUIRED,(char *)0x0);
    }
    if (literal != (xmlChar *)0x0) {
      pxVar3 = xmlStrchr(literal,'#');
      if (pxVar3 == (xmlChar *)0x0) {
        if (((*(long *)name != 0) && (*(int *)(name + 0x14c) == 0)) &&
           (*(long *)(*(long *)name + 0x30) != 0)) {
          (**(code **)(*(long *)name + 0x30))(*(undefined8 *)(name + 8),value,5,ndata,literal,0);
        }
      }
      else {
        xmlFatalErr((xmlParserCtxtPtr)name,XML_ERR_URI_FRAGMENT,(char *)0x0);
      }
    }
  }
  xmlSkipBlankCharsPE((xmlParserCtxtPtr)name);
  if (**(char **)(*(long *)(name + 0x38) + 0x20) == '>') {
    if (iVar1 != *(int *)(*(long *)(name + 0x38) + 100)) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_ENTITY_BOUNDARY,
                     "Entity declaration doesn\'t start and stop in the same entity\n");
    }
    xmlNextChar((xmlParserCtxtPtr)name);
  }
  else {
    xmlFatalErrMsgStr((xmlParserCtxtPtr)name,XML_ERR_ENTITY_NOT_FINISHED,
                      "xmlParseEntityDecl: entity %s not terminated\n",value);
    xmlHaltParser((xmlParserCtxtPtr)name);
  }
  if (pxStack_48 != (xmlChar *)0x0) {
    local_58 = (xmlEntityPtr)0x0;
    if (orig._4_4_ == 0) {
      if ((*(long *)name != 0) && (*(long *)(*(long *)name + 0x28) != 0)) {
        local_58 = (xmlEntityPtr)
                   (**(code **)(*(long *)name + 0x28))(*(undefined8 *)(name + 8),value);
      }
      if ((local_58 == (xmlEntityPtr)0x0) && (*(xmlChar **)(name + 8) == name)) {
        local_58 = xmlSAX2GetEntity(name,value);
      }
    }
    else if ((*(long *)name != 0) && (*(long *)(*(long *)name + 0xc0) != 0)) {
      local_58 = (xmlEntityPtr)(**(code **)(*(long *)name + 0xc0))(*(undefined8 *)(name + 8),value);
    }
    if ((local_58 != (xmlEntityPtr)0x0) && (local_58->orig == (xmlChar *)0x0)) {
      local_58->orig = pxStack_48;
      pxStack_48 = (xmlChar *)0x0;
    }
  }
LAB_00142f67:
  if (URI != (xmlChar *)0x0) {
    (*xmlFree)(URI);
  }
  if (literal != (xmlChar *)0x0) {
    (*xmlFree)(literal);
  }
  if (ndata != (xmlChar *)0x0) {
    (*xmlFree)(ndata);
  }
  if (pxStack_48 != (xmlChar *)0x0) {
    (*xmlFree)(pxStack_48);
  }
  return;
}

Assistant:

void
xmlParseEntityDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name = NULL;
    xmlChar *value = NULL;
    xmlChar *URI = NULL, *literal = NULL;
    const xmlChar *ndata = NULL;
    int isParameter = 0;
    xmlChar *orig = NULL;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    /* GROW; done in the caller */
    if (CMP6(CUR_PTR, 'E', 'N', 'T', 'I', 'T', 'Y')) {
	int inputid = ctxt->input->id;
	SKIP(6);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after '<!ENTITY'\n");
	}

	if (RAW == '%') {
	    NEXT;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after '%%'\n");
	    }
	    isParameter = 1;
	}

        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	                   "xmlParseEntityDecl: no name\n");
            return;
	}
	if (xmlStrchr(name, ':') != NULL) {
	    xmlNsErr(ctxt, XML_NS_ERR_COLON,
		     "colons are forbidden from entities names '%s'\n",
		     name, NULL, NULL);
	}
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the entity name\n");
	}

	/*
	 * handle the various case of definitions...
	 */
	if (isParameter) {
	    if ((RAW == '"') || (RAW == '\'')) {
	        value = xmlParseEntityValue(ctxt, &orig);
		if (value) {
		    if ((ctxt->sax != NULL) &&
			(!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
			ctxt->sax->entityDecl(ctxt->userData, name,
		                    XML_INTERNAL_PARAMETER_ENTITY,
				    NULL, NULL, value);
		}
	    } else {
	        URI = xmlParseExternalID(ctxt, &literal, 1);
		if ((URI == NULL) && (literal == NULL)) {
		    xmlFatalErr(ctxt, XML_ERR_VALUE_REQUIRED, NULL);
		}
		if (URI) {
                    if (xmlStrchr(URI, '#')) {
                        xmlFatalErr(ctxt, XML_ERR_URI_FRAGMENT, NULL);
                    } else {
                        if ((ctxt->sax != NULL) &&
                            (!ctxt->disableSAX) &&
                            (ctxt->sax->entityDecl != NULL))
                            ctxt->sax->entityDecl(ctxt->userData, name,
                                        XML_EXTERNAL_PARAMETER_ENTITY,
                                        literal, URI, NULL);
                    }
		}
	    }
	} else {
	    if ((RAW == '"') || (RAW == '\'')) {
	        value = xmlParseEntityValue(ctxt, &orig);
		if ((ctxt->sax != NULL) &&
		    (!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
		    ctxt->sax->entityDecl(ctxt->userData, name,
				XML_INTERNAL_GENERAL_ENTITY,
				NULL, NULL, value);
		/*
		 * For expat compatibility in SAX mode.
		 */
		if ((ctxt->myDoc == NULL) ||
		    (xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE))) {
		    if (ctxt->myDoc == NULL) {
			ctxt->myDoc = xmlNewDoc(SAX_COMPAT_MODE);
			if (ctxt->myDoc == NULL) {
			    xmlErrMemory(ctxt);
			    goto done;
			}
			ctxt->myDoc->properties = XML_DOC_INTERNAL;
		    }
		    if (ctxt->myDoc->intSubset == NULL) {
			ctxt->myDoc->intSubset = xmlNewDtd(ctxt->myDoc,
					    BAD_CAST "fake", NULL, NULL);
                        if (ctxt->myDoc->intSubset == NULL) {
                            xmlErrMemory(ctxt);
                            goto done;
                        }
                    }

		    xmlSAX2EntityDecl(ctxt, name, XML_INTERNAL_GENERAL_ENTITY,
			              NULL, NULL, value);
		}
	    } else {
	        URI = xmlParseExternalID(ctxt, &literal, 1);
		if ((URI == NULL) && (literal == NULL)) {
		    xmlFatalErr(ctxt, XML_ERR_VALUE_REQUIRED, NULL);
		}
		if (URI) {
                    if (xmlStrchr(URI, '#')) {
                        xmlFatalErr(ctxt, XML_ERR_URI_FRAGMENT, NULL);
                    }
		}
		if ((RAW != '>') && (SKIP_BLANKS_PE == 0)) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
				   "Space required before 'NDATA'\n");
		}
		if (CMP5(CUR_PTR, 'N', 'D', 'A', 'T', 'A')) {
		    SKIP(5);
		    if (SKIP_BLANKS_PE == 0) {
			xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
				       "Space required after 'NDATA'\n");
		    }
		    ndata = xmlParseName(ctxt);
		    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		        (ctxt->sax->unparsedEntityDecl != NULL))
			ctxt->sax->unparsedEntityDecl(ctxt->userData, name,
				    literal, URI, ndata);
		} else {
		    if ((ctxt->sax != NULL) &&
		        (!ctxt->disableSAX) && (ctxt->sax->entityDecl != NULL))
			ctxt->sax->entityDecl(ctxt->userData, name,
				    XML_EXTERNAL_GENERAL_PARSED_ENTITY,
				    literal, URI, NULL);
		    /*
		     * For expat compatibility in SAX mode.
		     * assuming the entity replacement was asked for
		     */
		    if ((ctxt->replaceEntities != 0) &&
			((ctxt->myDoc == NULL) ||
			(xmlStrEqual(ctxt->myDoc->version, SAX_COMPAT_MODE)))) {
			if (ctxt->myDoc == NULL) {
			    ctxt->myDoc = xmlNewDoc(SAX_COMPAT_MODE);
			    if (ctxt->myDoc == NULL) {
			        xmlErrMemory(ctxt);
				goto done;
			    }
			    ctxt->myDoc->properties = XML_DOC_INTERNAL;
			}

			if (ctxt->myDoc->intSubset == NULL) {
			    ctxt->myDoc->intSubset = xmlNewDtd(ctxt->myDoc,
						BAD_CAST "fake", NULL, NULL);
                            if (ctxt->myDoc->intSubset == NULL) {
                                xmlErrMemory(ctxt);
                                goto done;
                            }
                        }
			xmlSAX2EntityDecl(ctxt, name,
				          XML_EXTERNAL_GENERAL_PARSED_ENTITY,
				          literal, URI, NULL);
		    }
		}
	    }
	}
	SKIP_BLANKS_PE;
	if (RAW != '>') {
	    xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_NOT_FINISHED,
	            "xmlParseEntityDecl: entity %s not terminated\n", name);
	    xmlHaltParser(ctxt);
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                       "Entity declaration doesn't start and stop in"
                               " the same entity\n");
	    }
	    NEXT;
	}
	if (orig != NULL) {
	    /*
	     * Ugly mechanism to save the raw entity value.
	     */
	    xmlEntityPtr cur = NULL;

	    if (isParameter) {
	        if ((ctxt->sax != NULL) &&
		    (ctxt->sax->getParameterEntity != NULL))
		    cur = ctxt->sax->getParameterEntity(ctxt->userData, name);
	    } else {
	        if ((ctxt->sax != NULL) &&
		    (ctxt->sax->getEntity != NULL))
		    cur = ctxt->sax->getEntity(ctxt->userData, name);
		if ((cur == NULL) && (ctxt->userData==ctxt)) {
		    cur = xmlSAX2GetEntity(ctxt, name);
		}
	    }
            if ((cur != NULL) && (cur->orig == NULL)) {
		cur->orig = orig;
                orig = NULL;
	    }
	}

done:
	if (value != NULL) xmlFree(value);
	if (URI != NULL) xmlFree(URI);
	if (literal != NULL) xmlFree(literal);
        if (orig != NULL) xmlFree(orig);
    }
}